

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Error(sqlite3 *db,int err_code,char *zFormat,...)

{
  char in_AL;
  sqlite3_value *psVar1;
  char *z_00;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [24];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined1 local_48 [8];
  va_list ap;
  char *z;
  char *zFormat_local;
  int err_code_local;
  sqlite3 *db_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  if (db != (sqlite3 *)0x0) {
    local_e0 = in_RCX;
    local_d8 = in_R8;
    local_d0 = in_R9;
    if (db->pErr == (sqlite3_value *)0x0) {
      psVar1 = sqlite3ValueNew(db);
      db->pErr = psVar1;
      if (psVar1 == (sqlite3_value *)0x0) {
        return;
      }
    }
    db->errCode = err_code;
    if (zFormat == (char *)0x0) {
      sqlite3ValueSetStr(db->pErr,0,(void *)0x0,'\x01',(_func_void_void_ptr *)0x0);
    }
    else {
      ap[0].overflow_arg_area = local_f8;
      ap[0]._0_8_ = &stack0x00000008;
      local_48._4_4_ = 0x30;
      local_48._0_4_ = 0x18;
      z_00 = sqlite3VMPrintf(db,zFormat,(__va_list_tag *)local_48);
      sqlite3ValueSetStr(db->pErr,-1,z_00,'\x01',sqlite3MallocSize);
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Error(sqlite3 *db, int err_code, const char *zFormat, ...){
  if( db && (db->pErr || (db->pErr = sqlite3ValueNew(db))!=0) ){
    db->errCode = err_code;
    if( zFormat ){
      char *z;
      va_list ap;
      va_start(ap, zFormat);
      z = sqlite3VMPrintf(db, zFormat, ap);
      va_end(ap);
      sqlite3ValueSetStr(db->pErr, -1, z, SQLITE_UTF8, SQLITE_DYNAMIC);
    }else{
      sqlite3ValueSetStr(db->pErr, 0, 0, SQLITE_UTF8, SQLITE_STATIC);
    }
  }
}